

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

FuncInfo * ByteCodeGenerator::GetParentFuncInfo(FuncInfo *child)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Scope *pSVar4;
  
  pSVar4 = (Scope *)&child->bodyScope;
  do {
    pSVar4 = pSVar4->enclosingScope;
    if (pSVar4 == (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x73e,"(0)","0");
      if (bVar2) {
        *puVar3 = 0;
        return (FuncInfo *)0x0;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  } while (pSVar4->func == child);
  return pSVar4->func;
}

Assistant:

FuncInfo* ByteCodeGenerator::GetParentFuncInfo(FuncInfo* child)
{
    for (Scope* scope = child->GetBodyScope(); scope; scope = scope->GetEnclosingScope())
    {
        if (scope->GetFunc() != child)
        {
            return scope->GetFunc();
        }
    }
    Assert(0);
    return nullptr;
}